

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_ls.c
# Opt level: O0

int CVodeSetPreconditionerBS
              (void *cvode_mem,int which,CVLsPrecSetupFnBS psetupBS,CVLsPrecSolveFnBS psolveBS)

{
  CVLsPrecSolveFn psolve;
  undefined8 in_RCX;
  long in_RDX;
  int retval;
  CVLsPrecSolveFn cvls_psolve;
  CVLsPrecSetupFn cvls_psetup;
  CVLsMemB cvlsB_mem;
  void *cvodeB_mem;
  CVodeBMem cvB_mem;
  CVadjMem ca_mem;
  CVodeMem cv_mem;
  CVodeMem *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined8 in_stack_ffffffffffffffa0;
  void *in_stack_ffffffffffffffa8;
  CVadjMem in_stack_ffffffffffffffb0;
  CVLsMemB *in_stack_ffffffffffffffc0;
  int local_4;
  
  local_4 = cvLs_AccessLMemB(in_stack_ffffffffffffffa8,
                             (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                             (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                             in_stack_ffffffffffffff90,(CVadjMem *)&stack0xffffffffffffffb0,
                             (CVodeBMem *)0x13e9e4,in_stack_ffffffffffffffc0);
  if (local_4 == 0) {
    *(long *)&in_stack_ffffffffffffffb0->ca_firstCVodeBcall = in_RDX;
    *(undefined8 *)&in_stack_ffffffffffffffb0->ca_nckpnts = in_RCX;
    psolve = cvLsPrecSetupBSWrapper;
    if (in_RDX == 0) {
      psolve = (CVLsPrecSolveFn)0x0;
    }
    local_4 = CVodeSetPreconditioner
                        (in_stack_ffffffffffffffc0[2],(CVLsPrecSetupFn)in_stack_ffffffffffffffb0,
                         psolve);
  }
  return local_4;
}

Assistant:

int CVodeSetPreconditionerBS(void* cvode_mem, int which,
                             CVLsPrecSetupFnBS psetupBS,
                             CVLsPrecSolveFnBS psolveBS)
{
  CVodeMem cv_mem;
  CVadjMem ca_mem;
  CVodeBMem cvB_mem;
  void* cvodeB_mem;
  CVLsMemB cvlsB_mem;
  CVLsPrecSetupFn cvls_psetup;
  CVLsPrecSolveFn cvls_psolve;
  int retval;

  /* access relevant memory structures */
  retval = cvLs_AccessLMemB(cvode_mem, which, __func__, &cv_mem, &ca_mem,
                            &cvB_mem, &cvlsB_mem);
  if (retval != CVLS_SUCCESS) { return (retval); }

  /* Set preconditioners for the backward problem. */
  cvlsB_mem->psetBS   = psetupBS;
  cvlsB_mem->psolveBS = psolveBS;

  /* Call the corresponding "set" routine for the backward problem */
  cvodeB_mem  = (void*)(cvB_mem->cv_mem);
  cvls_psetup = (psetupBS == NULL) ? NULL : cvLsPrecSetupBSWrapper;
  cvls_psolve = (psolveBS == NULL) ? NULL : cvLsPrecSolveBSWrapper;
  return (CVodeSetPreconditioner(cvodeB_mem, cvls_psetup, cvls_psolve));
}